

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O1

string * testing::PrintToString<cfd::core::NetType>(string *__return_storage_ptr__,NetType *value)

{
  stringstream ss;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<long_long>((longlong)local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

::std::string PrintToString(const T& value) {
  ::std::stringstream ss;
  internal::UniversalTersePrinter<T>::Print(value, &ss);
  return ss.str();
}